

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

void __thiscall
andres::Marray<int,std::allocator<unsigned_long>>::
Marray<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (Marray<int,std::allocator<unsigned_long>> *this,InitializationSkipping *is,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          begin,__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                end,CoordinateOrder *coordinateOrder,allocator_type *allocator)

{
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var1;
  int *data;
  size_type __n;
  allocator_type local_31;
  
  View<int,_false,_std::allocator<unsigned_long>_>::View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)this,&local_31);
  __n = 1;
  for (_Var1._M_current = begin._M_current; _Var1._M_current != end._M_current;
      _Var1._M_current = _Var1._M_current + 1) {
    __n = __n * *_Var1._M_current;
  }
  marray_detail::Assert<bool>(__n != 0);
  data = __gnu_cxx::new_allocator<int>::allocate
                   ((new_allocator<int> *)(this + 0x40),__n,(void *)0x0);
  View<int,false,std::allocator<unsigned_long>>::
  assign<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)this,begin,end,data,coordinateOrder,
             coordinateOrder,allocator);
  Marray<int,_std::allocator<unsigned_long>_>::testInvariant
            ((Marray<int,_std::allocator<unsigned_long>_> *)this);
  return;
}

Assistant:

inline
Marray<T, A>::Marray
(
    const InitializationSkipping& is,
    ShapeIterator begin,
    ShapeIterator end,
    const CoordinateOrder& coordinateOrder,
    const allocator_type& allocator
) 
: dataAllocator_(allocator)
{
    std::size_t size = std::accumulate(begin, end, static_cast<std::size_t>(1), 
        std::multiplies<std::size_t>());
    marray_detail::Assert(MARRAY_NO_ARG_TEST || size != 0);
    base::assign(begin, end, dataAllocator_.allocate(size), coordinateOrder, 
        coordinateOrder, allocator); 
    testInvariant();
}